

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_tsetm(jit_State *J,BCReg ra,BCReg rn,int32_t i)

{
  TRef TVar1;
  lua_State *plVar2;
  MSize in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  GCtab *t;
  cTValue *basev;
  RecordIndex ix;
  int32_t in_stack_fffffffffffffedc;
  TRef in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  jit_State *J_00;
  uint local_108 [2];
  double local_100;
  undefined1 local_f8 [88];
  jit_State *local_a0;
  GCtrace *local_98;
  lua_State *local_90;
  uint *local_88;
  GCfunc *local_80;
  MSize local_74;
  double *local_70;
  char *ix_00;
  jit_State *pjVar3;
  
  J_00 = *(jit_State **)(*(long *)(in_RDI + 0x68) + 0x10);
  local_108[0] = (&(J_00->cur).nextgc)[(ulong)(in_ESI - 1) * 2].gcptr32;
  plVar2 = (lua_State *)(ulong)local_108[0];
  local_80 = *(GCfunc **)(in_RDI + 0x68);
  local_88 = local_108;
  local_108[1] = 0xfffffff4;
  local_f8._60_4_ = in_ECX;
  local_f8._64_4_ = in_EDX;
  local_f8._68_4_ = in_ESI;
  local_f8._72_8_ = in_RDI;
  local_90 = plVar2;
  if (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)(in_ESI - 1) * 4) == 0) {
    TVar1 = sload((jit_State *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  in_stack_fffffffffffffedc);
  }
  else {
    TVar1 = *(TRef *)(*(long *)(in_RDI + 0x88) + (ulong)(in_ESI - 1) * 4);
  }
  local_f8._52_4_ = 0;
  local_f8._32_4_ = TVar1;
  for (; (uint)local_f8._68_4_ < (uint)local_f8._64_4_; local_f8._68_4_ = local_f8._68_4_ + 1) {
    local_70 = &local_100;
    local_74 = local_f8._60_4_;
    local_100 = (double)(int)local_f8._60_4_;
    local_f8._36_4_ = lj_ir_kint(J_00,(int32_t)((ulong)plVar2 >> 0x20));
    local_98 = *(GCtrace **)(local_f8._72_8_ + 0x68);
    local_a0 = (jit_State *)local_f8;
    local_f8._80_8_ = &(J_00->cur).nextgc + (ulong)(uint)local_f8._68_4_ * 2;
    local_f8._0_8_ = *(undefined8 *)local_f8._80_8_;
    ix_00 = "copy of dead GC object";
    pjVar3 = local_a0;
    if (*(int *)(*(long *)(local_f8._72_8_ + 0x88) + (ulong)(uint)local_f8._68_4_ * 4) == 0) {
      in_stack_fffffffffffffee0 =
           sload((jit_State *)CONCAT44(TVar1,in_stack_fffffffffffffee0),in_stack_fffffffffffffedc);
    }
    else {
      in_stack_fffffffffffffee0 =
           *(TRef *)(*(long *)(local_f8._72_8_ + 0x88) + (ulong)(uint)local_f8._68_4_ * 4);
    }
    local_f8._40_4_ = in_stack_fffffffffffffee0;
    lj_record_idx(pjVar3,(RecordIndex *)ix_00);
    local_f8._60_4_ = local_f8._60_4_ + 1;
  }
  return;
}

Assistant:

static void rec_tsetm(jit_State *J, BCReg ra, BCReg rn, int32_t i)
{
  RecordIndex ix;
  cTValue *basev = J->L->base;
  GCtab *t = tabV(&basev[ra-1]);
  settabV(J->L, &ix.tabv, t);
  ix.tab = getslot(J, ra-1);
  ix.idxchain = 0;
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  if ((J->flags & JIT_F_OPT_SINK)) {
    if (t->asize < i+rn-ra)
      lj_tab_reasize(J->L, t, i+rn-ra);
    setnilV(&ix.keyv);
    rec_idx_bump(J, &ix);
  }
#endif
  for (; ra < rn; i++, ra++) {
    setintV(&ix.keyv, i);
    ix.key = lj_ir_kint(J, i);
    copyTV(J->L, &ix.valv, &basev[ra]);
    ix.val = getslot(J, ra);
    lj_record_idx(J, &ix);
  }
}